

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O1

void __thiscall xray_re::xr_object::save_object(xr_object *this,xr_writer *w)

{
  pointer ppxVar1;
  pointer ppxVar2;
  pointer ppxVar3;
  pointer ppxVar4;
  pointer ppxVar5;
  uint32_t uVar6;
  pointer ppxVar7;
  pointer ppxVar8;
  pointer ppxVar9;
  pointer ppxVar10;
  pointer ppxVar11;
  float local_3c;
  uint32_t *local_38;
  
  xr_writer::w_raw_chunk(w,0x900,&EOBJ_VERSION,2,false);
  xr_writer::open_chunk(w,0x912);
  xr_writer::w_sz(w,&this->m_userdata);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x925);
  xr_writer::w_sz(w,&this->m_lod_ref);
  xr_writer::close_chunk(w);
  local_38 = &this->m_flags;
  xr_writer::w_raw_chunk(w,0x903,local_38,4,false);
  xr_writer::open_chunk(w,0x910);
  ppxVar1 = (this->m_meshes).
            super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar6 = 0;
  for (ppxVar11 = (this->m_meshes).
                  super__Vector_base<xray_re::xr_mesh_*,_std::allocator<xray_re::xr_mesh_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppxVar11 != ppxVar1;
      ppxVar11 = ppxVar11 + 1) {
    xr_writer::open_chunk(w,uVar6);
    xr_mesh::save(*ppxVar11,w);
    xr_writer::close_chunk(w);
    uVar6 = uVar6 + 1;
  }
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x907);
  local_3c = (float)((ulong)((long)(this->m_surfaces).
                                   super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_surfaces).
                                  super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  ppxVar2 = (this->m_surfaces).
            super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppxVar7 = (this->m_surfaces).
                 super__Vector_base<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppxVar7 != ppxVar2; ppxVar7 = ppxVar7 + 1
      ) {
    xr_surface::save(*ppxVar7,w);
  }
  xr_writer::close_chunk(w);
  if ((this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_bones).super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x921);
    ppxVar8 = (this->m_bones).
              super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppxVar3 = (this->m_bones).
              super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppxVar8 != ppxVar3) {
      uVar6 = 0;
      do {
        xr_writer::open_chunk(w,uVar6);
        xr_bone::save(*ppxVar8,w);
        xr_writer::close_chunk(w);
        ppxVar8 = ppxVar8 + 1;
        uVar6 = uVar6 + 1;
      } while (ppxVar8 != ppxVar3);
    }
    xr_writer::close_chunk(w);
  }
  if ((this->m_motions).
      super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->m_motions).
      super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x916);
    local_3c = (float)((ulong)((long)(this->m_motions).
                                     super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_motions).
                                    super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    ppxVar4 = (this->m_motions).
              super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppxVar9 = (this->m_motions).
                   super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppxVar9 != ppxVar4;
        ppxVar9 = ppxVar9 + 1) {
      (*((*ppxVar9)->super_xr_motion)._vptr_xr_motion[3])(*ppxVar9,w);
    }
    xr_writer::close_chunk(w);
  }
  if ((this->m_motion_refs)._M_string_length != 0) {
    xr_writer::open_chunk(w,0x924);
    xr_writer::w_sz(w,&this->m_motion_refs);
    xr_writer::close_chunk(w);
  }
  if ((this->m_partitions).
      super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_partitions).
      super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    xr_writer::open_chunk(w,0x923);
    local_3c = (float)((ulong)((long)(this->m_partitions).
                                     super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_partitions).
                                    super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    ppxVar5 = (this->m_partitions).
              super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppxVar10 = (this->m_partitions).
                    super__Vector_base<xray_re::xr_partition_*,_std::allocator<xray_re::xr_partition_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppxVar10 != ppxVar5;
        ppxVar10 = ppxVar10 + 1) {
      xr_partition::save(*ppxVar10,w);
    }
    xr_writer::close_chunk(w);
  }
  if ((*local_38 & 1) != 0) {
    xr_writer::open_chunk(w,0x920);
    local_3c = (this->m_position).field_0.field_0.x;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = (this->m_position).field_0.field_0.y;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = (this->m_position).field_0.field_0.z;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = (this->m_rotation).field_0.field_0.x;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = (this->m_rotation).field_0.field_0.y;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    local_3c = (this->m_rotation).field_0.field_0.z;
    (*w->_vptr_xr_writer[2])(w,&local_3c,4);
    xr_writer::close_chunk(w);
  }
  xr_writer::open_chunk(w,0x922);
  xr_writer::w_sz(w,&this->m_owner_name);
  local_3c = (float)this->m_creation_time;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::w_sz(w,&this->m_modif_name);
  local_3c = (float)this->m_modified_time;
  (*w->_vptr_xr_writer[2])(w,&local_3c,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_object::save_object(xr_writer& w) const
{
	w.w_chunk<uint16_t>(EOBJ_CHUNK_VERSION, EOBJ_VERSION);

	w.w_chunk(EOBJ_CHUNK_USERDATA, m_userdata);

	w.w_chunk(EOBJ_CHUNK_LOD_REF, m_lod_ref);

	w.w_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags);

	w.open_chunk(EOBJ_CHUNK_MESHES);
	w.w_chunks(m_meshes, xr_writer::f_w_const<xr_mesh>(&xr_mesh::save));
	w.close_chunk();

	w.open_chunk(EOBJ_CHUNK_SURFACES_2);
	w.w_size_u32(m_surfaces.size());
	w.w_seq(m_surfaces, xr_writer::f_w_const<xr_surface>(&xr_surface::save));
	w.close_chunk();

	if (!m_bones.empty()) {
		w.open_chunk(EOBJ_CHUNK_BONES_1);
		w.w_chunks(m_bones, xr_writer::f_w_const<xr_bone>(&xr_bone::save));
		w.close_chunk();
	}
	if (!m_motions.empty()) {
		w.open_chunk(EOBJ_CHUNK_MOTIONS);
		w.w_size_u32(m_motions.size());
		w.w_seq(m_motions, xr_writer::f_w_const<xr_skl_motion>(&xr_skl_motion::save));
		w.close_chunk();
	}
	if (!m_motion_refs.empty()) {
		w.w_chunk(EOBJ_CHUNK_MOTION_REFS, m_motion_refs);
	}
	if (!m_partitions.empty()) {
		w.open_chunk(EOBJ_CHUNK_PARTITIONS_1);
		w.w_size_u32(m_partitions.size());
		w.w_seq(m_partitions, xr_writer::f_w_const<xr_partition>(&xr_partition::save));
		w.close_chunk();
	}
	if (m_flags & EOF_DYNAMIC) {
		w.open_chunk(EOBJ_CHUNK_TRANSFORM);
		w.w_fvector3(m_position);
		w.w_fvector3(m_rotation);
		w.close_chunk();
	}

	w.open_chunk(EOBJ_CHUNK_REVISION);
	w.w_sz(m_owner_name);
	w.w_u32(m_creation_time);
	w.w_sz(m_modif_name);
	w.w_u32(m_modified_time);
	w.close_chunk();
}